

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

bool check_more_than_two_unique_values
               (size_t *ix_arr,size_t st,size_t end,int *x,MissingAction missing_action)

{
  size_t *psVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = end - st;
  if (1 < uVar3) {
    if (missing_action == Fail) {
      psVar1 = ix_arr + st;
      uVar3 = st + 1;
      do {
        st = uVar3;
        if (end < st) {
          return false;
        }
        uVar3 = st + 1;
      } while (x[ix_arr[st]] == x[*psVar1]);
    }
    else {
      if (st <= end) {
        do {
          psVar1 = ix_arr + st;
          uVar3 = (ulong)(uint)x[*psVar1];
          st = st + 1;
          if (-1 < x[*psVar1]) break;
        } while (st <= end);
      }
      if (end < st) {
        return false;
      }
      if ((x[ix_arr[st]] < 0) || (x[ix_arr[st]] == (int)uVar3)) {
        uVar2 = st + 1;
        do {
          st = uVar2;
          if (end < st) {
            return false;
          }
          uVar2 = st + 1;
        } while ((x[ix_arr[st]] < 0) || (x[ix_arr[st]] == (int)uVar3));
      }
    }
    if (st <= end) {
      return true;
    }
  }
  return false;
}

Assistant:

bool check_more_than_two_unique_values(size_t ix_arr[], size_t st, size_t end, int x[], MissingAction missing_action)
{
    if (end - st <= 1) return false;

    if (missing_action == Fail)
    {
        int x0 = x[ix_arr[st]];
        for (size_t ix = st+1; ix <= end; ix++)
        {
            if (x[ix_arr[ix]] != x0) return true;
        }
    }

    else
    {
        int x0;
        size_t ix;
        for (ix = st; ix <= end; ix++)
        {
            if (x[ix_arr[ix]] >= 0)
            {
                x0 = x[ix_arr[ix]];
                ix++;
                break;
            }
        }

        for (; ix <= end; ix++)
        {
            if (x[ix_arr[ix]] >= 0 && x[ix_arr[ix]] != x0)
                return true;
        }
    }

    return false;
}